

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

int run_test_fs_null_req(void)

{
  int iVar1;
  int r;
  
  iVar1 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0,0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf29,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf2c,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,(uv_buf_t *)0x0,0,-1,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf2f,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_write((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,(uv_buf_t *)0x0,0,-1,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf32,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf35,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_mkdir((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf38,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_mkdtemp((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf3b,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_mkstemp((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf3e,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_rmdir((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf41,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_scandir((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf44,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(char *)0x0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf47,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_symlink((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(char *)0x0,0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf4a,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_readlink((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf4d,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_realpath((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf50,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_chown((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0,0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf53,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_fchown((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,0,0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf56,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_stat((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf59,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_lstat((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf5c,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_fstat((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf5f,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_rename((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(char *)0x0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf62,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_fsync((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf65,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_fdatasync((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf68,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_ftruncate((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf6b,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(char *)0x0,0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf6e,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_sendfile((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,0,0,0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf71,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_access((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf74,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_chmod((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf77,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_fchmod((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf7a,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_utime((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0.0,0.0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf7d,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_futime((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,0.0,0.0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf80,"r == UV_EINVAL");
    abort();
  }
  iVar1 = uv_fs_statfs((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
  if (iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
            ,0xf83,"r == UV_EINVAL");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)0x0);
  return 0;
}

Assistant:

TEST_IMPL(fs_null_req) {
  /* Verify that all fs functions return UV_EINVAL when the request is NULL. */
  int r;

  r = uv_fs_open(NULL, NULL, NULL, 0, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_close(NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_read(NULL, NULL, 0, NULL, 0, -1, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_write(NULL, NULL, 0, NULL, 0, -1, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_unlink(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_mkdir(NULL, NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_mkdtemp(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_mkstemp(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_rmdir(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_scandir(NULL, NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_link(NULL, NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_symlink(NULL, NULL, NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_readlink(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_realpath(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_chown(NULL, NULL, NULL, 0, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_fchown(NULL, NULL, 0, 0, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_stat(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_lstat(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_fstat(NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_rename(NULL, NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_fsync(NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_fdatasync(NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_ftruncate(NULL, NULL, 0, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_copyfile(NULL, NULL, NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_sendfile(NULL, NULL, 0, 0, 0, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_access(NULL, NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_chmod(NULL, NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_fchmod(NULL, NULL, 0, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_utime(NULL, NULL, NULL, 0.0, 0.0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_futime(NULL, NULL, 0, 0.0, 0.0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_statfs(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  /* This should be a no-op. */
  uv_fs_req_cleanup(NULL);

  return 0;
}